

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O1

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
stored<so_5::mchain_props::details::limited_dynamic_demand_queue>
          (deliver_op_tracer *this,limited_dynamic_demand_queue *queue)

{
  _Map_pointer ppdVar1;
  chain_size local_18;
  composed_action_name local_10;
  
  ppdVar1 = (queue->m_queue).
            super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_18.m_size =
       ((long)(queue->m_queue).
              super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last -
        (long)(queue->m_queue).
              super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
       ((long)(queue->m_queue).
              super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
        (long)(queue->m_queue).
              super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
       (((long)ppdVar1 -
         (long)(queue->m_queue).
               super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
       (ulong)(ppdVar1 == (_Map_pointer)0x0)) * 0x15;
  local_10.m_1 = this->m_op_name;
  local_10.m_2 = "stored";
  details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
            (this->m_tracer,this->m_chain,&local_10,this->m_msg_type,this->m_message,&local_18);
  return;
}

Assistant:

void
				stored( const QUEUE & queue )
					{
						make_trace( "stored", details::chain_size{ queue.size() } );
					}